

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O3

int scep_conf_load_operation_getnextca(CONF *conf)

{
  char *pcVar1;
  
  pcVar1 = NCONF_get_string((CONF *)conf,"sscep_getnextca","CAIdentifier");
  if ((pcVar1 != (char *)0x0) && (i_flag == 0)) {
    i_flag = 1;
    i_char = strdup(pcVar1);
    if (i_char == (char *)0x0) goto LAB_00108350;
  }
  pcVar1 = NCONF_get_string((CONF *)conf,"sscep_getnextca","ChainRootCACertFile");
  if ((pcVar1 != (char *)0x0) && (C_flag == 0)) {
    C_flag = 1;
    C_char = strdup(pcVar1);
    if (C_char == (char *)0x0) goto LAB_00108350;
  }
  pcVar1 = NCONF_get_string((CONF *)conf,"sscep_getnextca","FingerPrint");
  if ((pcVar1 != (char *)0x0) && (F_flag == 0)) {
    F_flag = 1;
    F_char = strdup(pcVar1);
    if (F_char == (char *)0x0) goto LAB_00108350;
  }
  pcVar1 = NCONF_get_string((CONF *)conf,"sscep_getnextca","SignerCertificateFile");
  if ((pcVar1 != (char *)0x0) && (w_flag == 0)) {
    w_flag = 1;
    w_char = strdup(pcVar1);
    if (w_char == (char *)0x0) {
LAB_00108350:
      error_memory();
    }
  }
  return 0;
}

Assistant:

int scep_conf_load_operation_getnextca(CONF *conf) {
    char *var;

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_GETNEXTCA, SCEP_CONFIGURATION_PARAM_CAIDENTIFIER)) && !i_flag) {
        i_flag = 1;
        if(!(i_char = strdup(var)))
            error_memory();
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_GETNEXTCA, SCEP_CONFIGURATION_PARAM_CERTROOTCHAINFILE)) && !C_flag) {
        C_flag = 1;
        if(!(C_char = strdup(var)))
            error_memory();
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_GETNEXTCA, SCEP_CONFIGURATION_PARAM_FINGERPRINT)) && !F_flag) {
        F_flag = 1;
        if(!(F_char = strdup(var)))
            error_memory();
    }

    if((var = NCONF_get_string(conf, SCEP_CONFIGURATION_SECTION_GETNEXTCA, SCEP_CONFIGURATION_PARAM_SIGNERCERTIFICATE)) && !w_flag) {
        w_flag = 1;
        if(!(w_char = strdup(var)))
            error_memory();
    }

    return 0;
}